

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::RenderLineStrip<ImPlot::GetterXsYs<int>,ImPlot::TransformerLinLin>
               (GetterXsYs<int> *getter,TransformerLinLin *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  ImPlotContext *pIVar1;
  bool bVar2;
  int i;
  int idx;
  uint uVar3;
  uint uVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ImPlotPoint IVar7;
  ImVec2 p1;
  ImVec2 p2;
  LineStripRenderer<ImPlot::GetterXsYs<int>,_ImPlot::TransformerLinLin> local_58;
  
  pIVar1 = GImPlot;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    LineStripRenderer<ImPlot::GetterXsYs<int>,_ImPlot::TransformerLinLin>::LineStripRenderer
              (&local_58,getter,transformer,col,line_weight);
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterXsYs<int>,ImPlot::TransformerLinLin>>
              (&local_58,DrawList,&pIVar1->CurrentPlot->PlotRect);
  }
  else {
    IVar7 = GetterXsYs<int>::operator()(getter,0);
    local_58.Getter = (GetterXsYs<int> *)IVar7.x;
    local_58.Transformer = (TransformerLinLin *)IVar7.y;
    p1 = TransformerLinLin::operator()(transformer,(ImPlotPoint *)&local_58);
    for (idx = 1; idx < getter->Count; idx = idx + 1) {
      IVar7 = GetterXsYs<int>::operator()(getter,idx);
      local_58.Getter = (GetterXsYs<int> *)IVar7.x;
      local_58.Transformer = (TransformerLinLin *)IVar7.y;
      p2 = TransformerLinLin::operator()(transformer,(ImPlotPoint *)&local_58);
      auVar5._8_8_ = 0;
      auVar5._0_4_ = p1.x;
      auVar5._4_4_ = p1.y;
      auVar6._8_4_ = extraout_XMM0_Dc;
      auVar6._0_4_ = p2.x;
      auVar6._4_4_ = p2.y;
      auVar6._12_4_ = extraout_XMM0_Dd;
      auVar6 = minps(auVar5,auVar6);
      uVar3 = -(uint)(p2.x <= p1.x);
      uVar4 = -(uint)(p2.y <= p1.y);
      local_58.Transformer =
           (TransformerLinLin *)
           (CONCAT44(~uVar4 & (uint)p2.y,~uVar3 & (uint)p2.x) |
           CONCAT44((uint)p1.y & uVar4,(uint)p1.x & uVar3));
      local_58.Getter = auVar6._0_8_;
      bVar2 = ImRect::Overlaps(&pIVar1->CurrentPlot->PlotRect,(ImRect *)&local_58);
      if (bVar2) {
        ImDrawList::AddLine(DrawList,&p1,&p2,col,line_weight);
      }
      p1 = p2;
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}